

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableModel::clearContents(QTableModel *this)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *pQVar2;
  pointer ppQVar3;
  int i;
  ulong uVar4;
  
  QAbstractItemModel::beginResetModel();
  for (uVar4 = 0; uVar4 < (ulong)(this->tableItems).d.size; uVar4 = uVar4 + 1) {
    ppQVar1 = (this->tableItems).d.ptr;
    pQVar2 = ppQVar1[uVar4];
    if (pQVar2 != (QTableWidgetItem *)0x0) {
      pQVar2->view = (QTableWidget *)0x0;
      pQVar2 = ppQVar1[uVar4];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        (*pQVar2->_vptr_QTableWidgetItem[1])();
      }
      ppQVar3 = QList<QTableWidgetItem_*>::data(&this->tableItems);
      ppQVar3[uVar4] = (QTableWidgetItem *)0x0;
    }
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void QTableModel::clearContents()
{
    beginResetModel();
    for (int i = 0; i < tableItems.size(); ++i) {
        if (tableItems.at(i)) {
            tableItems.at(i)->view = nullptr;
            delete tableItems.at(i);
            tableItems[i] = 0;
        }
    }
    endResetModel();
}